

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O2

void __thiscall QStackedLayout::addItem(QStackedLayout *this,QLayoutItem *item)

{
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*item->_vptr_QLayoutItem[0xd])(item);
  if ((QWidget *)CONCAT44(extraout_var,iVar1) == (QWidget *)0x0) {
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_20 = "default";
    QMessageLogger::warning(local_38,"QStackedLayout::addItem: Only widgets can be added");
  }
  else {
    addWidget(this,(QWidget *)CONCAT44(extraout_var,iVar1));
  }
  (*item->_vptr_QLayoutItem[1])(item);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStackedLayout::addItem(QLayoutItem *item)
{
    std::unique_ptr<QLayoutItem> guard(item);
    QWidget *widget = item->widget();
    if (Q_UNLIKELY(!widget)) {
        qWarning("QStackedLayout::addItem: Only widgets can be added");
        return;
    }
    addWidget(widget);
}